

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall pbrt::ParsedScene::ObjectBegin(ParsedScene *this,string *name,FileLoc loc)

{
  pointer *ppTVar1;
  pointer *pppVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
  *this_00;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  pointer pcVar3;
  pointer pAVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  iterator iVar36;
  mapped_type *pmVar37;
  string local_b0;
  pointer local_90;
  pointer pAStack_88;
  pointer local_80;
  vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> local_78;
  vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_> vStack_60;
  undefined1 local_48 [16];
  pointer local_38;
  
  if (this->currentApiState == OptionsBlock) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_allocated_capacity =
         (ulong)(uint7)local_b0.field_2._M_allocated_capacity._1_7_ << 8;
    detail::stringPrintfRecursive<char_const(&)[12]>
              (&local_b0,
               "Scene description must be inside world block; \"%s\" not allowed. Ignoring.",
               (char (*) [12])"ObjectBegin");
    Error(&loc,local_b0._M_dataplus._M_p);
  }
  else {
    if (this->currentApiState != Uninitialized) {
      std::
      vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>::
      push_back(&this->pushedGraphicsStates,this->graphicsState);
      __position._M_current =
           (this->pushedTransforms).
           super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->pushedTransforms).
          super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<pbrt::TransformSet,std::allocator<pbrt::TransformSet>>::
        _M_realloc_insert<pbrt::TransformSet_const&>
                  ((vector<pbrt::TransformSet,std::allocator<pbrt::TransformSet>> *)
                   &this->pushedTransforms,__position,&this->curTransform);
      }
      else {
        uVar5 = *(undefined8 *)(this->curTransform).t[0].m.m[0];
        uVar6 = *(undefined8 *)((this->curTransform).t[0].m.m[0] + 2);
        uVar7 = *(undefined8 *)(this->curTransform).t[0].m.m[1];
        uVar8 = *(undefined8 *)((this->curTransform).t[0].m.m[1] + 2);
        uVar9 = *(undefined8 *)(this->curTransform).t[0].m.m[2];
        uVar10 = *(undefined8 *)((this->curTransform).t[0].m.m[2] + 2);
        uVar11 = *(undefined8 *)(this->curTransform).t[0].m.m[3];
        uVar12 = *(undefined8 *)((this->curTransform).t[0].m.m[3] + 2);
        uVar13 = *(undefined8 *)(this->curTransform).t[0].mInv.m[0];
        uVar14 = *(undefined8 *)((this->curTransform).t[0].mInv.m[0] + 2);
        uVar15 = *(undefined8 *)(this->curTransform).t[0].mInv.m[1];
        uVar16 = *(undefined8 *)((this->curTransform).t[0].mInv.m[1] + 2);
        uVar17 = *(undefined8 *)(this->curTransform).t[0].mInv.m[2];
        uVar18 = *(undefined8 *)((this->curTransform).t[0].mInv.m[2] + 2);
        uVar19 = *(undefined8 *)(this->curTransform).t[0].mInv.m[3];
        uVar20 = *(undefined8 *)((this->curTransform).t[0].mInv.m[3] + 2);
        uVar21 = *(undefined8 *)(this->curTransform).t[1].m.m[0];
        uVar22 = *(undefined8 *)((this->curTransform).t[1].m.m[0] + 2);
        uVar23 = *(undefined8 *)(this->curTransform).t[1].m.m[1];
        uVar24 = *(undefined8 *)((this->curTransform).t[1].m.m[1] + 2);
        uVar25 = *(undefined8 *)(this->curTransform).t[1].m.m[2];
        uVar26 = *(undefined8 *)((this->curTransform).t[1].m.m[2] + 2);
        uVar27 = *(undefined8 *)(this->curTransform).t[1].m.m[3];
        uVar28 = *(undefined8 *)((this->curTransform).t[1].m.m[3] + 2);
        uVar29 = *(undefined8 *)((this->curTransform).t[1].mInv.m[0] + 2);
        uVar30 = *(undefined8 *)(this->curTransform).t[1].mInv.m[1];
        uVar31 = *(undefined8 *)((this->curTransform).t[1].mInv.m[1] + 2);
        uVar32 = *(undefined8 *)(this->curTransform).t[1].mInv.m[2];
        uVar33 = *(undefined8 *)((this->curTransform).t[1].mInv.m[2] + 2);
        uVar34 = *(undefined8 *)(this->curTransform).t[1].mInv.m[3];
        uVar35 = *(undefined8 *)((this->curTransform).t[1].mInv.m[3] + 2);
        *(undefined8 *)(__position._M_current)->t[1].mInv.m[0] =
             *(undefined8 *)(this->curTransform).t[1].mInv.m[0];
        *(undefined8 *)((__position._M_current)->t[1].mInv.m[0] + 2) = uVar29;
        *(undefined8 *)(__position._M_current)->t[1].mInv.m[1] = uVar30;
        *(undefined8 *)((__position._M_current)->t[1].mInv.m[1] + 2) = uVar31;
        *(undefined8 *)(__position._M_current)->t[1].mInv.m[2] = uVar32;
        *(undefined8 *)((__position._M_current)->t[1].mInv.m[2] + 2) = uVar33;
        *(undefined8 *)(__position._M_current)->t[1].mInv.m[3] = uVar34;
        *(undefined8 *)((__position._M_current)->t[1].mInv.m[3] + 2) = uVar35;
        *(undefined8 *)(__position._M_current)->t[1].m.m[0] = uVar21;
        *(undefined8 *)((__position._M_current)->t[1].m.m[0] + 2) = uVar22;
        *(undefined8 *)(__position._M_current)->t[1].m.m[1] = uVar23;
        *(undefined8 *)((__position._M_current)->t[1].m.m[1] + 2) = uVar24;
        *(undefined8 *)(__position._M_current)->t[1].m.m[2] = uVar25;
        *(undefined8 *)((__position._M_current)->t[1].m.m[2] + 2) = uVar26;
        *(undefined8 *)(__position._M_current)->t[1].m.m[3] = uVar27;
        *(undefined8 *)((__position._M_current)->t[1].m.m[3] + 2) = uVar28;
        *(undefined8 *)(__position._M_current)->t[0].mInv.m[0] = uVar13;
        *(undefined8 *)((__position._M_current)->t[0].mInv.m[0] + 2) = uVar14;
        *(undefined8 *)(__position._M_current)->t[0].mInv.m[1] = uVar15;
        *(undefined8 *)((__position._M_current)->t[0].mInv.m[1] + 2) = uVar16;
        *(undefined8 *)(__position._M_current)->t[0].mInv.m[2] = uVar17;
        *(undefined8 *)((__position._M_current)->t[0].mInv.m[2] + 2) = uVar18;
        *(undefined8 *)(__position._M_current)->t[0].mInv.m[3] = uVar19;
        *(undefined8 *)((__position._M_current)->t[0].mInv.m[3] + 2) = uVar20;
        *(undefined8 *)(__position._M_current)->t[0].m.m[0] = uVar5;
        *(undefined8 *)((__position._M_current)->t[0].m.m[0] + 2) = uVar6;
        *(undefined8 *)(__position._M_current)->t[0].m.m[1] = uVar7;
        *(undefined8 *)((__position._M_current)->t[0].m.m[1] + 2) = uVar8;
        *(undefined8 *)(__position._M_current)->t[0].m.m[2] = uVar9;
        *(undefined8 *)((__position._M_current)->t[0].m.m[2] + 2) = uVar10;
        *(undefined8 *)(__position._M_current)->t[0].m.m[3] = uVar11;
        *(undefined8 *)((__position._M_current)->t[0].m.m[3] + 2) = uVar12;
        ppTVar1 = &(this->pushedTransforms).
                   super__Vector_base<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
      __position_00._M_current =
           (this->pushedActiveTransformBits).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->pushedActiveTransformBits).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &this->pushedActiveTransformBits,__position_00,&this->activeTransformBits);
      }
      else {
        *__position_00._M_current = this->activeTransformBits;
        (this->pushedActiveTransformBits).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      local_b0._M_dataplus._M_p._0_1_ = 0x6f;
      local_b0.field_2._8_4_ = loc.line;
      local_b0.field_2._12_4_ = loc.column;
      local_b0._M_string_length = loc.filename._M_len;
      local_b0.field_2._M_allocated_capacity = (size_type)loc.filename._M_str;
      __position_01._M_current =
           (this->pushStack).
           super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_01._M_current ==
          (this->pushStack).
          super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<char,pbrt::FileLoc>,std::allocator<std::pair<char,pbrt::FileLoc>>>::
        _M_realloc_insert<std::pair<char,pbrt::FileLoc>>
                  ((vector<std::pair<char,pbrt::FileLoc>,std::allocator<std::pair<char,pbrt::FileLoc>>>
                    *)&this->pushStack,__position_01,(pair<char,_pbrt::FileLoc> *)&local_b0);
      }
      else {
        *(pointer *)__position_01._M_current = local_b0._M_dataplus._M_p;
        ((__position_01._M_current)->second).filename._M_len = loc.filename._M_len;
        ((__position_01._M_current)->second).filename._M_str = loc.filename._M_str;
        ((__position_01._M_current)->second).line = loc.line;
        ((__position_01._M_current)->second).column = loc.column;
        pppVar2 = &(this->pushStack).
                   super__Vector_base<std::pair<char,_pbrt::FileLoc>,_std::allocator<std::pair<char,_pbrt::FileLoc>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar2 = *pppVar2 + 1;
      }
      if (this->currentInstance != (InstanceDefinitionSceneEntity *)0x0) {
        (this->super_SceneRepresentation).errorExit = true;
        Error(&loc,"ObjectBegin called inside of instance definition");
        return;
      }
      this_00 = &this->instanceDefinitions;
      iVar36 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
               ::find(&this_00->_M_t,name);
      if ((_Rb_tree_header *)iVar36._M_node !=
          &(this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header) {
        SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                  (&this->super_SceneRepresentation,&loc,"%s: trying to redefine an object instance"
                   ,name);
        return;
      }
      local_38 = (pointer)loc._16_8_;
      local_48._0_8_ = loc.filename._M_len;
      local_48._8_8_ = loc.filename._M_str;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar3 = (name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar3,pcVar3 + name->_M_string_length);
      local_80 = local_38;
      local_90 = (pointer)local_48._0_8_;
      pAStack_88 = (pointer)local_48._8_8_;
      local_78.super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>.
      _M_impl.super__Vector_impl_data._M_finish = SUB328(ZEXT832(0),4);
      vStack_60.
      super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_60.
      super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78.super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_78.
           super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>.
           _M_impl.super__Vector_impl_data._M_start;
      vStack_60.
      super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_78.
                    super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      pmVar37 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
                ::operator[](this_00,name);
      std::__cxx11::string::operator=((string *)pmVar37,(string *)&local_b0);
      *(pointer *)&(pmVar37->loc).line = local_80;
      (pmVar37->loc).filename._M_len = (size_t)local_90;
      (pmVar37->loc).filename._M_str = (char *)pAStack_88;
      local_48._0_8_ =
           (pmVar37->shapes).
           super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>.
           _M_impl.super__Vector_impl_data._M_start;
      pAVar4 = (pointer)(pmVar37->shapes).
                        super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
      local_38 = (pointer)(pmVar37->shapes).
                          super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pmVar37->shapes).
      super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_78.
           super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (pmVar37->shapes).
      super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_78.
           super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (pmVar37->shapes).
      super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_78.
           super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_48._8_8_ = SUB168(ZEXT816(0),4);
      local_78.super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
      local_78.super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48._8_8_ = pAVar4;
      std::vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>::~vector
                ((vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *)local_48
                );
      local_48._0_8_ =
           (pmVar37->animatedShapes).
           super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_48._8_8_ =
           (pmVar37->animatedShapes).
           super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_38 = (pmVar37->animatedShapes).
                 super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pmVar37->animatedShapes).
      super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
      ._M_impl.super__Vector_impl_data._M_start =
           vStack_60.
           super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pmVar37->animatedShapes).
      super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           vStack_60.
           super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (pmVar37->animatedShapes).
      super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           vStack_60.
           super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      vStack_60.
      super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_60.
      super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_60.
      super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>::
      ~vector((vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
               *)local_48);
      std::vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>::
      ~vector(&vStack_60);
      std::vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>::~vector
                (&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        (ulong)(local_b0.field_2._M_allocated_capacity + 1));
      }
      pmVar37 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::InstanceDefinitionSceneEntity>_>_>
                ::operator[](this_00,name);
      this->currentInstance = pmVar37;
      return;
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_allocated_capacity =
         (ulong)(uint7)local_b0.field_2._M_allocated_capacity._1_7_ << 8;
    detail::stringPrintfRecursive<char_const(&)[12]>
              (&local_b0,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [12])"ObjectBegin");
    Error(&loc,local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ParsedScene::ObjectBegin(const std::string &name, FileLoc loc) {
    VERIFY_WORLD("ObjectBegin");
    pushedGraphicsStates.push_back(*graphicsState);
    pushedTransforms.push_back(curTransform);
    pushedActiveTransformBits.push_back(activeTransformBits);

    pushStack.push_back(std::make_pair('o', loc));

    if (currentInstance != nullptr) {
        ErrorExitDeferred(&loc, "ObjectBegin called inside of instance definition");
        return;
    }

    if (instanceDefinitions.find(name) != instanceDefinitions.end()) {
        ErrorExitDeferred(&loc, "%s: trying to redefine an object instance", name);
        return;
    }

    instanceDefinitions[name] = InstanceDefinitionSceneEntity(name, loc);
    // This should be safe since we're not adding anything to
    // instanceDefinitions until after ObjectEnd... (Still makes me
    // nervous.)
    currentInstance = &instanceDefinitions[name];
}